

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

void Frequent_BenchCmp<4u>(string *PATH)

{
  bool bVar1;
  int iVar2;
  Abstract<4U> *this;
  ostream *this_00;
  ostream *poVar3;
  ostream *this_01;
  mapped_type *pmVar4;
  void *pvVar5;
  value_type pbVar6;
  reference ppbVar7;
  ostream *poVar8;
  reference ppbVar9;
  double dVar10;
  basic_ostream<char,_std::char_traits<char>_> **out_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2_1;
  int j_1;
  int j;
  int l_1;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  int i_2;
  uint32_t i_1;
  basic_ostream<char,_std::char_traits<char>_> **out;
  iterator __end1;
  iterator __begin1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  int memory;
  int i;
  Abstract<4U> *sketches [6] [6];
  uint32_t topK;
  int l;
  HashMap<4U> mp;
  int nshrink;
  int K;
  int heap_size;
  int32_t cmp_num;
  int32_t mem_var;
  int32_t mem_inc;
  int32_t mem_base;
  string file;
  Data<4U> *items;
  count_type cnt;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  allocator_type *in_stack_fffffffffffffae0;
  size_type in_stack_fffffffffffffae8;
  LdSketchWrapper<4U> *in_stack_fffffffffffffaf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf8;
  Count_Heap<4U> *in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  WavingSketch<8U,_16U,_4U> *in_stack_fffffffffffffb10;
  int *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  char *in_stack_fffffffffffffb90;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_448;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_440;
  int local_434;
  int local_430;
  int local_42c;
  reference local_428;
  basic_ostream<char,_std::char_traits<char>_> **local_420;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_418;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_410;
  int local_408;
  uint local_404;
  reference local_400;
  basic_ostream<char,_std::char_traits<char>_> **local_3f8;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_3f0;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_3e8;
  undefined1 local_3d9;
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [39];
  undefined1 local_371;
  string local_370 [32];
  string local_350 [32];
  string local_330 [39];
  undefined1 local_309;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [39];
  undefined1 local_2a1;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [40];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  local_238;
  int local_220;
  int local_21c;
  long local_218 [43];
  int local_bc;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_b8;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_b0;
  int local_a4;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  int local_54;
  int local_50;
  allocator local_39;
  string local_38 [32];
  Abstract<4U> *local_18;
  int local_c;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  printf("\x1b[0m\x1b[1;4;33m# Testing function: BenchCmp\n\x1b[0m");
  local_c = 0;
  local_18 = (Abstract<4U> *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"caida",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::c_str();
  this = (Abstract<4U> *)
         read_standard_data<4u>(in_stack_fffffffffffffb90,iVar2,in_stack_fffffffffffffb80);
  local_18 = this;
  this_00 = std::operator<<((ostream *)&std::cout,"Total ");
  poVar3 = (ostream *)std::ostream::operator<<(this_00,local_c);
  this_01 = std::operator<<(poVar3," items");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  local_50 = 0;
  local_54 = 50000;
  local_58 = 6;
  local_5c = 6;
  local_60 = 0x9c4;
  local_64 = 2000;
  local_68 = 0;
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x10da52);
  for (local_a4 = 0; local_a4 < local_c; local_a4 = local_a4 + 1) {
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::find(in_stack_fffffffffffffac8,(key_type *)0x10da92);
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end(in_stack_fffffffffffffac8);
    bVar1 = std::__detail::operator==(&local_b0,&local_b8);
    if (bVar1) {
      pmVar4 = std::
               unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                             *)in_stack_fffffffffffffad0,(key_type *)in_stack_fffffffffffffac8);
      *pmVar4 = 1;
    }
    else {
      pmVar4 = std::
               unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                             *)in_stack_fffffffffffffad0,(key_type *)in_stack_fffffffffffffac8);
      *pmVar4 = *pmVar4 + 1;
    }
  }
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  iVar2 = Get_TopK<4u>((HashMap<4U> *)in_stack_fffffffffffffb10,
                       (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)0x10dc08);
  local_bc = iVar2;
  for (local_21c = 0; local_21c < 6; local_21c = local_21c + 1) {
    local_220 = local_50 + local_54 * (local_21c + 1);
    pvVar5 = operator_new(0xa8);
    WavingSketch<8U,_1U,_4U>::WavingSketch
              ((WavingSketch<8U,_1U,_4U> *)in_stack_fffffffffffffb10,
               (uint32_t)((ulong)in_stack_fffffffffffffb08 >> 0x20));
    local_218[(long)local_21c * 6] = (long)pvVar5;
    pvVar5 = operator_new(0xa8);
    WavingSketch<8U,_16U,_4U>::WavingSketch
              (in_stack_fffffffffffffb10,(uint32_t)((ulong)in_stack_fffffffffffffb08 >> 0x20));
    local_218[(long)local_21c * 6 + 1] = (long)pvVar5;
    pvVar5 = operator_new(0x78);
    SS<4U>::SS((SS<4U> *)in_stack_fffffffffffffaf0,(uint32_t)(in_stack_fffffffffffffae8 >> 0x20));
    local_218[(long)local_21c * 6 + 2] = (long)pvVar5;
    pvVar5 = operator_new(0x78);
    USS<4U>::USS((USS<4U> *)in_stack_fffffffffffffaf0,(uint32_t)(in_stack_fffffffffffffae8 >> 0x20))
    ;
    local_218[(long)local_21c * 6 + 3] = (long)pvVar5;
    pvVar5 = operator_new(0x88);
    Count_Heap<4U>::Count_Heap
              (in_stack_fffffffffffffb00,(uint32_t)((ulong)in_stack_fffffffffffffaf8 >> 0x20),
               (uint32_t)in_stack_fffffffffffffaf8,
               (uint32_t)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
    local_218[(long)local_21c * 6 + 4] = (long)pvVar5;
    pvVar5 = operator_new(0x80);
    LdSketchWrapper<4U>::LdSketchWrapper
              (in_stack_fffffffffffffaf0,(uint32_t)(in_stack_fffffffffffffae8 >> 0x20),
               (int)in_stack_fffffffffffffae8);
    local_218[(long)local_21c * 6 + 5] = (long)pvVar5;
  }
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10dfc0);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::~allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10dfe6);
  pbVar6 = (value_type)operator_new(0x200);
  local_2a1 = 1;
  std::operator+(in_stack_fffffffffffffaf8,(char *)in_stack_fffffffffffffaf0);
  std::operator+(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
  std::ofstream::ofstream(pbVar6,local_260,0x10);
  local_2a1 = 0;
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_238,0);
  *ppbVar7 = pbVar6;
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_2a0);
  pbVar6 = (value_type)operator_new(0x200);
  local_309 = 1;
  std::operator+(in_stack_fffffffffffffaf8,(char *)in_stack_fffffffffffffaf0);
  std::operator+(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
  std::ofstream::ofstream(pbVar6,local_2c8,0x10);
  local_309 = 0;
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_238,1);
  *ppbVar7 = pbVar6;
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_308);
  pbVar6 = (value_type)operator_new(0x200);
  local_371 = 1;
  std::operator+(in_stack_fffffffffffffaf8,(char *)in_stack_fffffffffffffaf0);
  std::operator+(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
  std::ofstream::ofstream(pbVar6,local_330,0x10);
  local_371 = 0;
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_238,2);
  *ppbVar7 = pbVar6;
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_370);
  pbVar6 = (value_type)operator_new(0x200);
  local_3d9 = 1;
  std::operator+(in_stack_fffffffffffffaf8,(char *)in_stack_fffffffffffffaf0);
  std::operator+(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
  std::ofstream::ofstream(pbVar6,local_398,0x10);
  local_3d9 = 0;
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_238,3);
  *ppbVar7 = pbVar6;
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string(local_3d8);
  local_3e8 = &local_238;
  local_3f0._M_current =
       (basic_ostream<char,_std::char_traits<char>_> **)
       std::
       vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                *)in_stack_fffffffffffffac8);
  local_3f8 = (basic_ostream<char,_std::char_traits<char>_> **)
              std::
              vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                     *)in_stack_fffffffffffffac8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                        *)in_stack_fffffffffffffad0,
                       (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                        *)in_stack_fffffffffffffac8);
    if (!bVar1) break;
    local_400 = __gnu_cxx::
                __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                ::operator*(&local_3f0);
    poVar8 = std::operator<<((ostream *)*local_400,"MEM(KB)");
    std::operator<<(poVar8,",");
    for (local_404 = 0; local_404 < 6; local_404 = local_404 + 1) {
      poVar8 = std::operator<<((ostream *)*local_400,(string *)(local_218[local_404] + 8));
      std::operator<<(poVar8,",");
    }
    std::ostream::operator<<((ostream *)*local_400,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
    ::operator++(&local_3f0);
  }
  for (local_408 = 0; local_408 < 6; local_408 = local_408 + 1) {
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",
           (ulong)(uint)((local_50 + local_54 * (local_408 + 1)) / 1000));
    local_410 = &local_238;
    local_418._M_current =
         (basic_ostream<char,_std::char_traits<char>_> **)
         std::
         vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
         ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)in_stack_fffffffffffffac8);
    local_420 = (basic_ostream<char,_std::char_traits<char>_> **)
                std::
                vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                       *)in_stack_fffffffffffffac8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                          *)in_stack_fffffffffffffad0,
                         (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                          *)in_stack_fffffffffffffac8);
      if (!bVar1) break;
      local_428 = __gnu_cxx::
                  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                  ::operator*(&local_418);
      poVar8 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)*local_428,(local_50 + local_54 * (local_408 + 1)) / 1000);
      std::operator<<(poVar8,",");
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&local_418);
    }
    in_stack_fffffffffffffae0 =
         (allocator_type *)
         LdSketchWrapper<4U>::average_l((LdSketchWrapper<4U> *)local_218[(long)local_408 * 6 + 5]);
    printf("Init average l: %lf\n",in_stack_fffffffffffffae0);
    for (local_42c = 0; local_42c < local_c; local_42c = local_42c + 1) {
      for (local_430 = 0; local_430 < 6; local_430 = local_430 + 1) {
        (*(code *)**(undefined8 **)local_218[(long)local_408 * 6 + (long)local_430])
                  ((undefined8 *)local_218[(long)local_408 * 6 + (long)local_430],
                   (uchar *)((long)&local_18->_vptr_Abstract + (long)local_42c * 4));
      }
    }
    dVar10 = LdSketchWrapper<4U>::average_l
                       ((LdSketchWrapper<4U> *)local_218[(long)local_408 * 6 + 5]);
    printf("After average l: %lf\n",dVar10);
    for (local_434 = 0; local_434 < 6; local_434 = local_434 + 1) {
      Abstract<4U>::Check(this,(HashMap<4U> *)this_00,(count_type)((ulong)poVar3 >> 0x20),
                          (vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                           *)this_01);
      in_stack_fffffffffffffad0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_218[(long)local_408 * 6 + (long)local_434];
      if (in_stack_fffffffffffffad0 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)in_stack_fffffffffffffad0 + 0x48))();
      }
    }
    local_440 = &local_238;
    local_448._M_current =
         (basic_ostream<char,_std::char_traits<char>_> **)
         std::
         vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
         ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)in_stack_fffffffffffffac8);
    std::
    vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)in_stack_fffffffffffffac8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                          *)in_stack_fffffffffffffad0,
                         (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                          *)in_stack_fffffffffffffac8);
      if (!bVar1) break;
      ppbVar9 = __gnu_cxx::
                __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                ::operator*(&local_448);
      std::ostream::operator<<((ostream *)*ppbVar9,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&local_448);
    }
  }
  if (local_18 != (Abstract<4U> *)0x0) {
    operator_delete(local_18,4);
  }
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)in_stack_fffffffffffffae0);
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)0x10eb09);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Frequent_BenchCmp(std::string PATH) {
	printf("\033[0m\033[1;4;33m# Testing function: BenchCmp\n\033[0m");
	count_type cnt = 0;
	Data<DATA_LEN>* items = NULL;
	std::string file = "caida";

	items = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	std::cout << "Total " << cnt << " items" << std::endl;
	int32_t mem_base = 0;
	int32_t mem_inc = 50000;
	constexpr int32_t mem_var = 6;
	constexpr int32_t cmp_num = 6;
	int heap_size = 2500, K = 2000;
	// constexpr int32_t num_inc = 10;
	int nshrink = 0;
	// Ground truth
	HashMap<DATA_LEN> mp;
	for (int l = 0; l < cnt; ++l) {
		if (mp.find(items[l]) == mp.end())
			mp[items[l]] = 1;
		else
			mp[items[l]] += 1;
	}
	uint32_t topK = Get_TopK(mp, K);

	Abstract<DATA_LEN>* sketches[mem_var][cmp_num];

	for (int i = 0; i < mem_var; ++i) {
		int memory = (mem_base + mem_inc * (i + 1));
		sketches[i][0] = new WavingSketch<8, 1, DATA_LEN>(memory / (8 * 8 + 1 * 2));
		sketches[i][1] = new WavingSketch<8, 16, DATA_LEN>(memory / (8 * 8 + 16 * 2));
		sketches[i][2] = new SS<DATA_LEN>(memory / 100);
		sketches[i][3] = new USS<DATA_LEN>(memory / 100);
		sketches[i][4] = new Count_Heap<DATA_LEN>(heap_size, (memory - heap_size * (sizeof(Data<DATA_LEN>) + 4)) / 12, 3);
		sketches[i][5] = new LdSketchWrapper<DATA_LEN>(memory, topK);
	}

	std::vector<std::ostream*> outs(4);
	outs[0] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_Recall Rate (RR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_Precision Rate (PR).csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_F1.csv");

	for (auto& out : outs)
	{
		*out << "MEM(KB)" << ",";
		for (uint32_t i = 0; i < cmp_num; i++)
		{
			*out << sketches[0][i]->name << ",";
		}
		*out << std::endl;
	}

	for (int i = 0; i < mem_var; ++i) {
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m",
			(mem_base + mem_inc * (i + 1)) / 1000);
		for (auto& out : outs)
		{
			*out << (mem_base + mem_inc * (i + 1)) / 1000 << ",";
		}
		printf("Init average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][5])->average_l());
		for (int l = 0; l < cnt; ++l) {
			for (int j = 0; j < cmp_num; ++j) {
				sketches[i][j]->Init(items[l]);
			}
		}
		printf("After average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][5])->average_l());

		for (int j = 0; j < cmp_num; ++j) {
			sketches[i][j]->Check(mp, topK, outs);
			delete sketches[i][j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}

	delete items;
}